

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalUnixMakefileGenerator3.cxx
# Opt level: O2

void __thiscall
cmLocalUnixMakefileGenerator3::CheckMultipleOutputs
          (cmLocalUnixMakefileGenerator3 *this,bool verbose)

{
  string *psVar1;
  cmMakefile *this_00;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  string *source;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pairs;
  char *local_1c8 [4];
  ostringstream msg;
  
  this_00 = (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile;
  std::__cxx11::string::string((string *)&msg,"CMAKE_MULTIPLE_OUTPUT_PAIRS",(allocator *)local_1c8);
  pcVar3 = cmMakefile::GetDefinition(this_00,(string *)&msg);
  std::__cxx11::string::~string((string *)&msg);
  if (pcVar3 != (char *)0x0) {
    pairs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    pairs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pairs.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::__cxx11::string::string((string *)&msg,pcVar3,(allocator *)local_1c8);
    cmSystemTools::ExpandListArgument((string *)&msg,&pairs,true);
    std::__cxx11::string::~string((string *)&msg);
    source = pairs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
    while( true ) {
      psVar1 = source + -1;
      if ((psVar1 == pairs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish) ||
         (source == pairs.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish)) break;
      bVar2 = cmsys::SystemTools::FileExists((source->_M_dataplus)._M_p);
      if (bVar2) {
        bVar2 = cmsys::SystemTools::FileExists((psVar1->_M_dataplus)._M_p);
        if (!bVar2) {
          if (verbose) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
            poVar4 = std::operator<<((ostream *)&msg,"Deleting primary custom command output \"");
            poVar4 = std::operator<<(poVar4,(string *)source);
            poVar4 = std::operator<<(poVar4,"\" because another output \"");
            poVar4 = std::operator<<(poVar4,(string *)psVar1);
            poVar4 = std::operator<<(poVar4,"\" does not exist.");
            std::endl<char,std::char_traits<char>>(poVar4);
            std::__cxx11::stringbuf::str();
            cmSystemTools::Stdout(local_1c8[0]);
            std::__cxx11::string::~string((string *)local_1c8);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
          }
          cmsys::SystemTools::RemoveFile(source);
        }
      }
      source = source + 2;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&pairs);
  }
  return;
}

Assistant:

void cmLocalUnixMakefileGenerator3::CheckMultipleOutputs(bool verbose)
{
  cmMakefile* mf = this->Makefile;

  // Get the string listing the multiple output pairs.
  const char* pairs_string = mf->GetDefinition("CMAKE_MULTIPLE_OUTPUT_PAIRS");
  if(!pairs_string)
    {
    return;
    }

  // Convert the string to a list and preserve empty entries.
  std::vector<std::string> pairs;
  cmSystemTools::ExpandListArgument(pairs_string, pairs, true);
  for(std::vector<std::string>::const_iterator i = pairs.begin();
      i != pairs.end() && (i+1) != pairs.end();)
    {
    const std::string& depender = *i++;
    const std::string& dependee = *i++;

    // If the depender is missing then delete the dependee to make
    // sure both will be regenerated.
    if(cmSystemTools::FileExists(dependee.c_str()) &&
       !cmSystemTools::FileExists(depender.c_str()))
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Deleting primary custom command output \"" << dependee
            << "\" because another output \""
            << depender << "\" does not exist." << std::endl;
        cmSystemTools::Stdout(msg.str().c_str());
        }
      cmSystemTools::RemoveFile(dependee);
      }
    }
}